

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  undefined1 (*pauVar1) [16];
  ulong *puVar2;
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  uint uVar22;
  undefined4 uVar23;
  _func_int **pp_Var24;
  ulong *puVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  vint4 ai;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 ai_1;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vint4 ai_3;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 bi;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 bi_1;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 bi_3;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 ai_2;
  undefined1 auVar58 [16];
  vint4 bi_2;
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  vint<4> mask;
  vint4 bi_8;
  vint<4> octant;
  vfloat<8> fmin;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  AccelData *local_26d8;
  ulong local_26d0;
  RayHitK<4> *local_26c8;
  RayQueryContext *local_26c0;
  ulong local_26b8;
  ulong local_26b0;
  long local_26a8;
  long local_26a0;
  ulong local_2698;
  undefined1 local_2690 [16];
  float local_2680;
  float fStack_267c;
  float fStack_2678;
  float fStack_2674;
  float local_2670;
  float fStack_266c;
  float fStack_2668;
  float fStack_2664;
  float local_2660;
  float fStack_265c;
  float fStack_2658;
  float fStack_2654;
  undefined1 local_2650 [16];
  RTCIntersectFunctionNArguments local_2640;
  Geometry *local_2610;
  undefined8 local_2608;
  RTCIntersectArguments *local_2600;
  undefined4 local_25f0;
  undefined4 uStack_25ec;
  undefined4 uStack_25e8;
  undefined4 uStack_25e4;
  undefined1 local_25e0 [16];
  float local_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float local_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  uint local_2560;
  uint uStack_255c;
  uint uStack_2558;
  uint uStack_2554;
  uint uStack_2550;
  uint uStack_254c;
  uint uStack_2548;
  uint uStack_2544;
  undefined4 local_2540;
  undefined4 uStack_253c;
  undefined4 uStack_2538;
  undefined4 uStack_2534;
  undefined4 uStack_2530;
  undefined4 uStack_252c;
  undefined4 uStack_2528;
  undefined4 uStack_2524;
  uint local_2520;
  uint uStack_251c;
  uint uStack_2518;
  uint uStack_2514;
  uint uStack_2510;
  uint uStack_250c;
  uint uStack_2508;
  uint uStack_2504;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  uint local_2460;
  uint uStack_245c;
  uint uStack_2458;
  uint uStack_2454;
  uint uStack_2450;
  uint uStack_244c;
  uint uStack_2448;
  uint uStack_2444;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  uint local_2420;
  uint uStack_241c;
  uint uStack_2418;
  uint uStack_2414;
  uint uStack_2410;
  uint uStack_240c;
  uint uStack_2408;
  uint uStack_2404;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  float local_23c0;
  float fStack_23bc;
  float fStack_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar40 [64];
  
  auVar46 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar36 = vpcmpeqd_avx(auVar46,(undefined1  [16])valid_i->field_0);
  uVar22 = vmovmskps_avx(auVar36);
  if (uVar22 != 0) {
    local_26d8 = This->ptr;
    local_26d0 = (ulong)(uVar22 & 0xff);
    auVar43._8_4_ = 0x7fffffff;
    auVar43._0_8_ = 0x7fffffff7fffffff;
    auVar43._12_4_ = 0x7fffffff;
    auVar39 = *(undefined1 (*) [16])(ray + 0x40);
    auVar4 = vandps_avx(auVar39,auVar43);
    auVar50._8_4_ = 0x219392ef;
    auVar50._0_8_ = 0x219392ef219392ef;
    auVar50._12_4_ = 0x219392ef;
    auVar4 = vcmpps_avx(auVar4,auVar50,1);
    auVar44 = vblendvps_avx(auVar39,auVar50,auVar4);
    auVar4 = *(undefined1 (*) [16])(ray + 0x50);
    auVar48 = vandps_avx(auVar4,auVar43);
    auVar48 = vcmpps_avx(auVar48,auVar50,1);
    auVar47 = vblendvps_avx(auVar4,auVar50,auVar48);
    auVar48 = *(undefined1 (*) [16])(ray + 0x60);
    auVar43 = vandps_avx(auVar48,auVar43);
    auVar43 = vcmpps_avx(auVar43,auVar50,1);
    auVar43 = vblendvps_avx(auVar48,auVar50,auVar43);
    auVar50 = vrcpps_avx(auVar44);
    auVar55._8_4_ = 0x3f800000;
    auVar55._0_8_ = 0x3f8000003f800000;
    auVar55._12_4_ = 0x3f800000;
    auVar44 = vfnmadd213ps_fma(auVar44,auVar50,auVar55);
    local_2580 = vfmadd132ps_fma(auVar44,auVar50,auVar50);
    auVar62 = ZEXT1664(local_2580);
    auVar44 = vrcpps_avx(auVar47);
    auVar47 = vfnmadd213ps_fma(auVar47,auVar44,auVar55);
    local_2590 = vfmadd132ps_fma(auVar47,auVar44,auVar44);
    auVar63 = ZEXT1664(local_2590);
    auVar44 = vrcpps_avx(auVar43);
    auVar43 = vfnmadd213ps_fma(auVar43,auVar44,auVar55);
    local_25a0 = vfmadd132ps_fma(auVar43,auVar44,auVar44);
    auVar64 = ZEXT1664(local_25a0);
    auVar43 = ZEXT816(0) << 0x20;
    local_2690 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar43);
    local_25e0 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar43);
    auVar39 = vcmpps_avx(auVar39,auVar43,1);
    auVar44._8_4_ = 1;
    auVar44._0_8_ = 0x100000001;
    auVar44._12_4_ = 1;
    auVar39 = vandps_avx(auVar39,auVar44);
    auVar4 = vcmpps_avx(auVar4,auVar43,1);
    auVar47._8_4_ = 2;
    auVar47._0_8_ = 0x200000002;
    auVar47._12_4_ = 2;
    auVar4 = vandps_avx(auVar4,auVar47);
    auVar4 = vorps_avx(auVar4,auVar39);
    auVar39 = vcmpps_avx(auVar48,auVar43,1);
    auVar48._8_4_ = 4;
    auVar48._0_8_ = 0x400000004;
    auVar48._12_4_ = 4;
    auVar39 = vandps_avx(auVar39,auVar48);
    auVar46 = vpor_avx(auVar36 ^ auVar46,auVar39);
    local_2650 = vpor_avx(auVar46,auVar4);
    local_25b0 = *(float *)ray;
    fStack_25ac = *(float *)(ray + 4);
    fStack_25a8 = *(float *)(ray + 8);
    fStack_25a4 = *(float *)(ray + 0xc);
    local_2660 = local_2580._0_4_ * -*(float *)ray;
    fStack_265c = local_2580._4_4_ * -*(float *)(ray + 4);
    fStack_2658 = local_2580._8_4_ * -*(float *)(ray + 8);
    fStack_2654 = local_2580._12_4_ * -*(float *)(ray + 0xc);
    local_25c0 = *(float *)(ray + 0x10);
    fStack_25bc = *(float *)(ray + 0x14);
    fStack_25b8 = *(float *)(ray + 0x18);
    fStack_25b4 = *(float *)(ray + 0x1c);
    local_2670 = local_2590._0_4_ * -*(float *)(ray + 0x10);
    fStack_266c = local_2590._4_4_ * -*(float *)(ray + 0x14);
    fStack_2668 = local_2590._8_4_ * -*(float *)(ray + 0x18);
    fStack_2664 = local_2590._12_4_ * -*(float *)(ray + 0x1c);
    local_25d0 = *(float *)(ray + 0x20);
    fStack_25cc = *(float *)(ray + 0x24);
    fStack_25c8 = *(float *)(ray + 0x28);
    fStack_25c4 = *(float *)(ray + 0x2c);
    local_2680 = local_25a0._0_4_ * -*(float *)(ray + 0x20);
    fStack_267c = local_25a0._4_4_ * -*(float *)(ray + 0x24);
    fStack_2678 = local_25a0._8_4_ * -*(float *)(ray + 0x28);
    fStack_2674 = local_25a0._12_4_ * -*(float *)(ray + 0x2c);
    local_2560 = 0x80000000;
    uStack_255c = 0x80000000;
    uStack_2558 = 0x80000000;
    uStack_2554 = 0x80000000;
    uStack_2550 = 0x80000000;
    uStack_254c = 0x80000000;
    uStack_2548 = 0x80000000;
    uStack_2544 = 0x80000000;
    local_25f0 = 0x7f800000;
    uStack_25ec = 0x7f800000;
    uStack_25e8 = 0x7f800000;
    uStack_25e4 = 0x7f800000;
    local_26c8 = ray;
    local_26c0 = context;
    do {
      lVar11 = 0;
      for (uVar29 = local_26d0; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
        lVar11 = lVar11 + 1;
      }
      uVar23 = *(undefined4 *)(local_2650 + lVar11 * 4);
      auVar36._4_4_ = uVar23;
      auVar36._0_4_ = uVar23;
      auVar36._8_4_ = uVar23;
      auVar36._12_4_ = uVar23;
      auVar41 = vpcmpeqd_avx(auVar36,local_2650);
      uVar23 = vmovmskps_avx(auVar41);
      local_26d0 = ~CONCAT44((int)((ulong)lVar11 >> 0x20),uVar23) & local_26d0;
      auVar6._4_4_ = fStack_25ac;
      auVar6._0_4_ = local_25b0;
      auVar6._8_4_ = fStack_25a8;
      auVar6._12_4_ = fStack_25a4;
      auVar56._8_4_ = 0x7f800000;
      auVar56._0_8_ = 0x7f8000007f800000;
      auVar56._12_4_ = 0x7f800000;
      auVar46 = vblendvps_avx(auVar56,auVar6,auVar41);
      auVar36 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar46 = vminps_avx(auVar36,auVar46);
      auVar36 = vshufpd_avx(auVar46,auVar46,1);
      auVar36 = vminps_avx(auVar36,auVar46);
      auVar4._4_4_ = fStack_25bc;
      auVar4._0_4_ = local_25c0;
      auVar4._8_4_ = fStack_25b8;
      auVar4._12_4_ = fStack_25b4;
      auVar46 = vblendvps_avx(auVar56,auVar4,auVar41);
      auVar39 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar46 = vminps_avx(auVar39,auVar46);
      auVar39 = vshufpd_avx(auVar46,auVar46,1);
      auVar39 = vminps_avx(auVar39,auVar46);
      auVar5._4_4_ = fStack_25cc;
      auVar5._0_4_ = local_25d0;
      auVar5._8_4_ = fStack_25c8;
      auVar5._12_4_ = fStack_25c4;
      auVar46 = vblendvps_avx(auVar56,auVar5,auVar41);
      auVar36 = vinsertps_avx(auVar36,auVar39,0x1c);
      auVar39 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar46 = vminps_avx(auVar39,auVar46);
      auVar39 = vshufpd_avx(auVar46,auVar46,1);
      auVar46 = vminps_avx(auVar39,auVar46);
      auVar39 = vinsertps_avx(auVar36,auVar46,0x20);
      auVar58._8_4_ = 0xff800000;
      auVar58._0_8_ = 0xff800000ff800000;
      auVar58._12_4_ = 0xff800000;
      auVar46 = vblendvps_avx(auVar58,auVar6,auVar41);
      auVar36 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar46 = vmaxps_avx(auVar36,auVar46);
      auVar36 = vshufpd_avx(auVar46,auVar46,1);
      auVar36 = vmaxps_avx(auVar36,auVar46);
      auVar46 = vblendvps_avx(auVar58,auVar4,auVar41);
      auVar4 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar46 = vmaxps_avx(auVar4,auVar46);
      auVar4 = vshufpd_avx(auVar46,auVar46,1);
      auVar4 = vmaxps_avx(auVar4,auVar46);
      auVar46 = vblendvps_avx(auVar58,auVar5,auVar41);
      auVar36 = vinsertps_avx(auVar36,auVar4,0x1c);
      auVar4 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar46 = vmaxps_avx(auVar4,auVar46);
      auVar4 = vshufpd_avx(auVar46,auVar46,1);
      auVar46 = vmaxps_avx(auVar4,auVar46);
      auVar48 = vinsertps_avx(auVar36,auVar46,0x20);
      auVar46 = vblendvps_avx(auVar56,auVar62._0_16_,auVar41);
      auVar36 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar46 = vminps_avx(auVar36,auVar46);
      auVar36 = vshufpd_avx(auVar46,auVar46,1);
      auVar36 = vminps_avx(auVar36,auVar46);
      auVar46 = vblendvps_avx(auVar56,auVar63._0_16_,auVar41);
      auVar4 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar46 = vminps_avx(auVar4,auVar46);
      auVar4 = vshufpd_avx(auVar46,auVar46,1);
      auVar4 = vminps_avx(auVar4,auVar46);
      auVar46 = vblendvps_avx(auVar56,auVar64._0_16_,auVar41);
      auVar36 = vinsertps_avx(auVar36,auVar4,0x1c);
      auVar4 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar46 = vminps_avx(auVar4,auVar46);
      auVar4 = vshufpd_avx(auVar46,auVar46,1);
      auVar46 = vminps_avx(auVar4,auVar46);
      auVar43 = vinsertps_avx(auVar36,auVar46,0x20);
      auVar46 = vblendvps_avx(auVar58,auVar62._0_16_,auVar41);
      auVar36 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar46 = vmaxps_avx(auVar36,auVar46);
      auVar36 = vshufpd_avx(auVar46,auVar46,1);
      auVar36 = vmaxps_avx(auVar36,auVar46);
      auVar46 = vblendvps_avx(auVar58,auVar63._0_16_,auVar41);
      auVar4 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar46 = vmaxps_avx(auVar4,auVar46);
      auVar4 = vshufpd_avx(auVar46,auVar46,1);
      auVar4 = vmaxps_avx(auVar4,auVar46);
      auVar46 = vblendvps_avx(auVar58,auVar64._0_16_,auVar41);
      auVar36 = vinsertps_avx(auVar36,auVar4,0x1c);
      auVar4 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar46 = vmaxps_avx(auVar4,auVar46);
      auVar4 = vshufpd_avx(auVar46,auVar46,1);
      auVar46 = vmaxps_avx(auVar4,auVar46);
      auVar44 = vinsertps_avx(auVar36,auVar46,0x20);
      auVar46 = vblendvps_avx(auVar56,local_2690,auVar41);
      auVar36 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar50 = vminps_avx(auVar36,auVar46);
      local_2700 = vblendvps_avx(auVar58,local_25e0,auVar41);
      auVar5 = vshufpd_avx(auVar50,auVar50,1);
      auVar46 = vshufps_avx(local_2700,local_2700,0xb1);
      auVar47 = vmaxps_avx(auVar46,local_2700);
      auVar4 = vcmpps_avx(auVar43,_DAT_01f7aa10,5);
      auVar46 = vblendvps_avx(auVar44,auVar43,auVar4);
      auVar36 = vblendvps_avx(auVar39,auVar48,auVar4);
      auVar6 = vshufpd_avx(auVar47,auVar47,1);
      auVar39 = vblendvps_avx(auVar48,auVar39,auVar4);
      local_23c0 = auVar46._0_4_;
      auVar55 = vmovshdup_avx(auVar46);
      uVar30 = (ulong)(auVar55._0_4_ < 0.0) << 5 | 0x40;
      auVar48 = vshufpd_avx(auVar46,auVar46,1);
      local_26f0 = vmaxps_avx(auVar6,auVar47);
      auVar61 = ZEXT1664(CONCAT412(fStack_2664,
                                   CONCAT48(fStack_2668,CONCAT44(fStack_266c,local_2670))));
      auVar60 = ZEXT1664(CONCAT412(fStack_2654,
                                   CONCAT48(fStack_2658,CONCAT44(fStack_265c,local_2660))));
      uVar35 = (ulong)(auVar48._0_4_ < 0.0) << 5 | 0x80;
      local_2698 = uVar30 ^ 0x20;
      auVar48 = vminps_avx(auVar5,auVar50);
      auVar4 = vblendvps_avx(auVar43,auVar44,auVar4);
      auVar53._0_4_ = auVar36._0_4_ * local_23c0;
      auVar53._4_4_ = auVar36._4_4_ * auVar46._4_4_;
      auVar53._8_4_ = auVar36._8_4_ * auVar46._8_4_;
      auVar53._12_4_ = auVar36._12_4_ * auVar46._12_4_;
      local_2480 = auVar4._0_4_;
      auVar51._0_4_ = auVar39._0_4_ * local_2480;
      auVar51._4_4_ = auVar39._4_4_ * auVar4._4_4_;
      auVar51._8_4_ = auVar39._8_4_ * auVar4._8_4_;
      auVar51._12_4_ = auVar39._12_4_ * auVar4._12_4_;
      auVar59 = ZEXT1664(CONCAT412(fStack_2674,
                                   CONCAT48(fStack_2678,CONCAT44(fStack_267c,local_2680))));
      uVar29 = (ulong)(local_23c0 < 0.0) << 5;
      uVar31 = uVar29 ^ 0x20;
      local_23a0 = *(ulong *)&local_26d8[1].bounds.bounds0.lower.field_0;
      local_2398[0] = 0;
      fStack_23bc = local_23c0;
      fStack_23b8 = local_23c0;
      fStack_23b4 = local_23c0;
      fStack_23b0 = local_23c0;
      fStack_23ac = local_23c0;
      fStack_23a8 = local_23c0;
      fStack_23a4 = local_23c0;
      local_23e0 = local_2560 ^ (uint)auVar53._0_4_;
      uStack_23dc = uStack_255c ^ (uint)auVar53._0_4_;
      uStack_23d8 = uStack_2558 ^ (uint)auVar53._0_4_;
      uStack_23d4 = uStack_2554 ^ (uint)auVar53._0_4_;
      uStack_23d0 = uStack_2550 ^ (uint)auVar53._0_4_;
      uStack_23cc = uStack_254c ^ (uint)auVar53._0_4_;
      uStack_23c8 = uStack_2548 ^ (uint)auVar53._0_4_;
      uStack_23c4 = uStack_2544 ^ (uint)auVar53._0_4_;
      local_2400 = auVar55._0_8_;
      uStack_23f8 = local_2400;
      uStack_23f0 = local_2400;
      uStack_23e8 = local_2400;
      auVar36 = vmovshdup_avx(auVar53);
      uVar22 = auVar36._0_4_;
      uVar7 = auVar36._4_4_;
      local_2420 = local_2560 ^ uVar22;
      uStack_241c = uStack_255c ^ uVar7;
      uStack_2418 = uStack_2558 ^ uVar22;
      uStack_2414 = uStack_2554 ^ uVar7;
      uStack_2410 = uStack_2550 ^ uVar22;
      uStack_240c = uStack_254c ^ uVar7;
      uStack_2408 = uStack_2548 ^ uVar22;
      uStack_2404 = uStack_2544 ^ uVar7;
      auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
      local_2440 = auVar46._0_8_;
      uStack_2438 = local_2440;
      uStack_2430 = local_2440;
      uStack_2428 = local_2440;
      auVar46 = vshufps_avx(auVar53,auVar53,0xaa);
      uVar22 = auVar46._0_4_;
      uVar7 = auVar46._4_4_;
      local_2460 = local_2560 ^ uVar22;
      uStack_245c = uStack_255c ^ uVar7;
      uStack_2458 = uStack_2558 ^ uVar22;
      uStack_2454 = uStack_2554 ^ uVar7;
      uStack_2450 = uStack_2550 ^ uVar22;
      uStack_244c = uStack_254c ^ uVar7;
      uStack_2448 = uStack_2548 ^ uVar22;
      uStack_2444 = uStack_2544 ^ uVar7;
      fStack_247c = local_2480;
      fStack_2478 = local_2480;
      fStack_2474 = local_2480;
      fStack_2470 = local_2480;
      fStack_246c = local_2480;
      fStack_2468 = local_2480;
      fStack_2464 = local_2480;
      local_24a0 = local_2560 ^ (uint)auVar51._0_4_;
      uStack_249c = uStack_255c ^ (uint)auVar51._0_4_;
      uStack_2498 = uStack_2558 ^ (uint)auVar51._0_4_;
      uStack_2494 = uStack_2554 ^ (uint)auVar51._0_4_;
      uStack_2490 = uStack_2550 ^ (uint)auVar51._0_4_;
      uStack_248c = uStack_254c ^ (uint)auVar51._0_4_;
      uStack_2488 = uStack_2548 ^ (uint)auVar51._0_4_;
      uStack_2484 = uStack_2544 ^ (uint)auVar51._0_4_;
      auVar46 = vmovshdup_avx(auVar4);
      local_24c0 = auVar46._0_8_;
      uStack_24b8 = local_24c0;
      uStack_24b0 = local_24c0;
      uStack_24a8 = local_24c0;
      auVar46 = vmovshdup_avx(auVar51);
      uVar22 = auVar46._0_4_;
      uVar7 = auVar46._4_4_;
      local_24e0 = local_2560 ^ uVar22;
      uStack_24dc = uStack_255c ^ uVar7;
      uStack_24d8 = uStack_2558 ^ uVar22;
      uStack_24d4 = uStack_2554 ^ uVar7;
      uStack_24d0 = uStack_2550 ^ uVar22;
      uStack_24cc = uStack_254c ^ uVar7;
      uStack_24c8 = uStack_2548 ^ uVar22;
      uStack_24c4 = uStack_2544 ^ uVar7;
      auVar46 = vshufps_avx(auVar4,auVar4,0xaa);
      local_2500 = auVar46._0_8_;
      uStack_24f8 = local_2500;
      uStack_24f0 = local_2500;
      uStack_24e8 = local_2500;
      auVar46 = vshufps_avx(auVar51,auVar51,0xaa);
      uVar22 = auVar46._0_4_;
      uVar7 = auVar46._4_4_;
      local_2520 = local_2560 ^ uVar22;
      uStack_251c = uStack_255c ^ uVar7;
      uStack_2518 = uStack_2558 ^ uVar22;
      uStack_2514 = uStack_2554 ^ uVar7;
      uStack_2510 = uStack_2550 ^ uVar22;
      uStack_250c = uStack_254c ^ uVar7;
      uStack_2508 = uStack_2548 ^ uVar22;
      uStack_2504 = uStack_2544 ^ uVar7;
      local_2710._0_4_ = auVar48._0_4_;
      local_2540 = local_2710._0_4_;
      uStack_253c = local_2710._0_4_;
      uStack_2538 = local_2710._0_4_;
      uStack_2534 = local_2710._0_4_;
      uStack_2530 = local_2710._0_4_;
      uStack_252c = local_2710._0_4_;
      uStack_2528 = local_2710._0_4_;
      uStack_2524 = local_2710._0_4_;
      auVar46._4_4_ = uStack_25ec;
      auVar46._0_4_ = local_25f0;
      auVar46._8_4_ = uStack_25e8;
      auVar46._12_4_ = uStack_25e4;
      local_2710 = vblendvps_avx(auVar46,local_2690,auVar41);
      puVar25 = local_2390;
      uVar23 = local_26f0._0_4_;
      auVar38 = ZEXT3264(CONCAT428(uVar23,CONCAT424(uVar23,CONCAT420(uVar23,CONCAT416(uVar23,
                                                  CONCAT412(uVar23,CONCAT48(uVar23,CONCAT44(uVar23,
                                                  uVar23))))))));
      local_26b8 = uVar30;
      local_26b0 = uVar29;
      do {
        uVar23 = (undefined4)puVar25[-1];
        auVar39._4_4_ = uVar23;
        auVar39._0_4_ = uVar23;
        auVar39._8_4_ = uVar23;
        auVar39._12_4_ = uVar23;
        auVar40 = ZEXT1664(auVar39);
        puVar25 = puVar25 + -2;
        auVar46 = vcmpps_avx(auVar39,local_2700,1);
        if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar46[0xf] < '\0') {
          uVar32 = *puVar25;
          while ((uVar32 & 8) == 0) {
            auVar20._4_4_ = uStack_23dc;
            auVar20._0_4_ = local_23e0;
            auVar20._8_4_ = uStack_23d8;
            auVar20._12_4_ = uStack_23d4;
            auVar20._16_4_ = uStack_23d0;
            auVar20._20_4_ = uStack_23cc;
            auVar20._24_4_ = uStack_23c8;
            auVar20._28_4_ = uStack_23c4;
            auVar21._4_4_ = fStack_23bc;
            auVar21._0_4_ = local_23c0;
            auVar21._8_4_ = fStack_23b8;
            auVar21._12_4_ = fStack_23b4;
            auVar21._16_4_ = fStack_23b0;
            auVar21._20_4_ = fStack_23ac;
            auVar21._24_4_ = fStack_23a8;
            auVar21._28_4_ = fStack_23a4;
            auVar46 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar29),auVar20,auVar21
                                     );
            auVar8._4_4_ = uStack_241c;
            auVar8._0_4_ = local_2420;
            auVar8._8_4_ = uStack_2418;
            auVar8._12_4_ = uStack_2414;
            auVar8._16_4_ = uStack_2410;
            auVar8._20_4_ = uStack_240c;
            auVar8._24_4_ = uStack_2408;
            auVar8._28_4_ = uStack_2404;
            auVar19._8_8_ = uStack_23f8;
            auVar19._0_8_ = local_2400;
            auVar19._16_8_ = uStack_23f0;
            auVar19._24_8_ = uStack_23e8;
            auVar36 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar30),auVar8,auVar19)
            ;
            auVar8 = vpmaxsd_avx2(ZEXT1632(auVar46),ZEXT1632(auVar36));
            auVar17._4_4_ = uStack_245c;
            auVar17._0_4_ = local_2460;
            auVar17._8_4_ = uStack_2458;
            auVar17._12_4_ = uStack_2454;
            auVar17._16_4_ = uStack_2450;
            auVar17._20_4_ = uStack_244c;
            auVar17._24_4_ = uStack_2448;
            auVar17._28_4_ = uStack_2444;
            auVar18._8_8_ = uStack_2438;
            auVar18._0_8_ = local_2440;
            auVar18._16_8_ = uStack_2430;
            auVar18._24_8_ = uStack_2428;
            auVar46 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar35),auVar17,auVar18
                                     );
            auVar9._4_4_ = uStack_253c;
            auVar9._0_4_ = local_2540;
            auVar9._8_4_ = uStack_2538;
            auVar9._12_4_ = uStack_2534;
            auVar9._16_4_ = uStack_2530;
            auVar9._20_4_ = uStack_252c;
            auVar9._24_4_ = uStack_2528;
            auVar9._28_4_ = uStack_2524;
            auVar9 = vpmaxsd_avx2(ZEXT1632(auVar46),auVar9);
            auVar8 = vpmaxsd_avx2(auVar8,auVar9);
            auVar15._4_4_ = uStack_249c;
            auVar15._0_4_ = local_24a0;
            auVar15._8_4_ = uStack_2498;
            auVar15._12_4_ = uStack_2494;
            auVar15._16_4_ = uStack_2490;
            auVar15._20_4_ = uStack_248c;
            auVar15._24_4_ = uStack_2488;
            auVar15._28_4_ = uStack_2484;
            auVar16._4_4_ = fStack_247c;
            auVar16._0_4_ = local_2480;
            auVar16._8_4_ = fStack_2478;
            auVar16._12_4_ = fStack_2474;
            auVar16._16_4_ = fStack_2470;
            auVar16._20_4_ = fStack_246c;
            auVar16._24_4_ = fStack_2468;
            auVar16._28_4_ = fStack_2464;
            auVar46 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar31),auVar15,auVar16
                                     );
            auVar13._4_4_ = uStack_24dc;
            auVar13._0_4_ = local_24e0;
            auVar13._8_4_ = uStack_24d8;
            auVar13._12_4_ = uStack_24d4;
            auVar13._16_4_ = uStack_24d0;
            auVar13._20_4_ = uStack_24cc;
            auVar13._24_4_ = uStack_24c8;
            auVar13._28_4_ = uStack_24c4;
            auVar14._8_8_ = uStack_24b8;
            auVar14._0_8_ = local_24c0;
            auVar14._16_8_ = uStack_24b0;
            auVar14._24_8_ = uStack_24a8;
            auVar36 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar32 + 0x40 + local_2698),auVar13,
                                      auVar14);
            auVar9 = vpminsd_avx2(ZEXT1632(auVar46),ZEXT1632(auVar36));
            auVar10._4_4_ = uStack_251c;
            auVar10._0_4_ = local_2520;
            auVar10._8_4_ = uStack_2518;
            auVar10._12_4_ = uStack_2514;
            auVar10._16_4_ = uStack_2510;
            auVar10._20_4_ = uStack_250c;
            auVar10._24_4_ = uStack_2508;
            auVar10._28_4_ = uStack_2504;
            auVar12._8_8_ = uStack_24f8;
            auVar12._0_8_ = local_2500;
            auVar12._16_8_ = uStack_24f0;
            auVar12._24_8_ = uStack_24e8;
            auVar46 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar32 + 0x40 + (uVar35 ^ 0x20)),
                                      auVar10,auVar12);
            auVar10 = vpminsd_avx2(ZEXT1632(auVar46),auVar38._0_32_);
            auVar9 = vpminsd_avx2(auVar9,auVar10);
            local_2640.valid = (int *)auVar8._0_8_;
            local_2640.geometryUserPtr = (void *)auVar8._8_8_;
            local_2640.primID = auVar8._16_4_;
            local_2640._20_4_ = auVar8._20_4_;
            local_2640.context = (RTCRayQueryContext *)auVar8._24_8_;
            auVar8 = vcmpps_avx(auVar8,auVar9,2);
            iVar26 = vmovmskps_avx(auVar8);
            if (iVar26 == 0) goto LAB_005f2dea;
            uVar28 = (ulong)(byte)iVar26;
            auVar40 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            uVar27 = 0;
            uVar33 = 8;
            do {
              lVar11 = 0;
              for (uVar34 = uVar28; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                lVar11 = lVar11 + 1;
              }
              uVar23 = *(undefined4 *)(uVar32 + 0x40 + lVar11 * 4);
              auVar41._4_4_ = uVar23;
              auVar41._0_4_ = uVar23;
              auVar41._8_4_ = uVar23;
              auVar41._12_4_ = uVar23;
              auVar39 = vfmadd213ps_fma(auVar41,auVar62._0_16_,auVar60._0_16_);
              uVar23 = *(undefined4 *)(uVar32 + 0x80 + lVar11 * 4);
              auVar45._4_4_ = uVar23;
              auVar45._0_4_ = uVar23;
              auVar45._8_4_ = uVar23;
              auVar45._12_4_ = uVar23;
              auVar4 = vfmadd213ps_fma(auVar45,auVar63._0_16_,auVar61._0_16_);
              uVar23 = *(undefined4 *)(uVar32 + 0xc0 + lVar11 * 4);
              auVar49._4_4_ = uVar23;
              auVar49._0_4_ = uVar23;
              auVar49._8_4_ = uVar23;
              auVar49._12_4_ = uVar23;
              auVar48 = vfmadd213ps_fma(auVar49,auVar64._0_16_,auVar59._0_16_);
              uVar23 = *(undefined4 *)(uVar32 + 0x60 + lVar11 * 4);
              auVar52._4_4_ = uVar23;
              auVar52._0_4_ = uVar23;
              auVar52._8_4_ = uVar23;
              auVar52._12_4_ = uVar23;
              auVar43 = vfmadd213ps_fma(auVar52,auVar62._0_16_,auVar60._0_16_);
              uVar23 = *(undefined4 *)(uVar32 + 0xa0 + lVar11 * 4);
              auVar54._4_4_ = uVar23;
              auVar54._0_4_ = uVar23;
              auVar54._8_4_ = uVar23;
              auVar54._12_4_ = uVar23;
              auVar44 = vfmadd213ps_fma(auVar54,auVar63._0_16_,auVar61._0_16_);
              uVar23 = *(undefined4 *)(uVar32 + 0xe0 + lVar11 * 4);
              auVar57._4_4_ = uVar23;
              auVar57._0_4_ = uVar23;
              auVar57._8_4_ = uVar23;
              auVar57._12_4_ = uVar23;
              auVar47 = vfmadd213ps_fma(auVar57,auVar64._0_16_,auVar59._0_16_);
              auVar46 = vpminsd_avx(auVar39,auVar43);
              auVar36 = vpminsd_avx(auVar4,auVar44);
              auVar46 = vpmaxsd_avx(auVar46,auVar36);
              auVar36 = vpminsd_avx(auVar48,auVar47);
              auVar36 = vpmaxsd_avx(auVar36,local_2710);
              auVar46 = vpmaxsd_avx(auVar46,auVar36);
              auVar36 = vpmaxsd_avx(auVar39,auVar43);
              auVar39 = vpmaxsd_avx(auVar4,auVar44);
              auVar39 = vpminsd_avx(auVar36,auVar39);
              auVar36 = vpmaxsd_avx(auVar48,auVar47);
              auVar36 = vpminsd_avx(auVar36,local_2700);
              auVar36 = vpminsd_avx(auVar39,auVar36);
              auVar46 = vcmpps_avx(auVar46,auVar36,2);
              uVar34 = uVar33;
              if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar46[0xf] < '\0') {
                uVar23 = *(undefined4 *)((long)&local_2640.valid + lVar11 * 4);
                auVar42._4_4_ = uVar23;
                auVar42._0_4_ = uVar23;
                auVar42._8_4_ = uVar23;
                auVar42._12_4_ = uVar23;
                uVar34 = *(ulong *)(uVar32 + lVar11 * 8);
                auVar36 = auVar40._0_16_;
                auVar46 = vcmpps_avx(auVar42,auVar36,1);
                if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar46 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar46 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar46[0xf]) {
                  *puVar25 = uVar34;
                  uVar34 = uVar33;
                }
                else {
                  if (uVar33 == 8) {
                    auVar40 = ZEXT1664(auVar42);
                    goto LAB_005f2b6c;
                  }
                  *puVar25 = uVar33;
                  auVar40 = ZEXT1664(auVar42);
                  auVar42 = auVar36;
                }
                uVar27 = uVar27 + 1;
                *(int *)(puVar25 + 1) = auVar42._0_4_;
                puVar25 = puVar25 + 2;
              }
LAB_005f2b6c:
              uVar28 = uVar28 - 1 & uVar28;
              uVar33 = uVar34;
            } while (uVar28 != 0);
            if (uVar34 == 8) goto LAB_005f2dea;
            uVar32 = uVar34;
            if (1 < uVar27) {
              pauVar1 = (undefined1 (*) [16])(puVar25 + -4);
              puVar2 = puVar25 + -2;
              if ((uint)puVar25[-3] < (uint)puVar25[-1]) {
                *(int *)(puVar25 + -3) = (int)puVar25[-1];
                *(ulong *)*pauVar1 = *puVar2;
                local_2720._0_8_ = SUB168(*pauVar1,0);
                *puVar2 = local_2720._0_8_;
                local_2720._8_4_ = SUB164(*pauVar1,8);
                *(undefined4 *)(puVar25 + -1) = local_2720._8_4_;
              }
              if (uVar27 != 2) {
                pauVar3 = (undefined1 (*) [16])(puVar25 + -6);
                uVar22 = (uint)puVar25[-5];
                if (uVar22 < (uint)puVar25[-1]) {
                  *(int *)(puVar25 + -5) = (int)puVar25[-1];
                  *(ulong *)*pauVar3 = *puVar2;
                  local_2720._0_8_ = SUB168(*pauVar3,0);
                  *puVar2 = local_2720._0_8_;
                  local_2720._8_4_ = SUB164(*pauVar3,8);
                  *(undefined4 *)(puVar25 + -1) = local_2720._8_4_;
                  uVar22 = (uint)puVar25[-5];
                }
                if (uVar22 < (uint)puVar25[-3]) {
                  auVar46 = *pauVar3;
                  *(int *)(puVar25 + -5) = (int)puVar25[-3];
                  *(undefined8 *)*pauVar3 = *(undefined8 *)*pauVar1;
                  local_2720._0_8_ = auVar46._0_8_;
                  *(undefined8 *)*pauVar1 = local_2720._0_8_;
                  local_2720._8_4_ = auVar46._8_4_;
                  *(undefined4 *)(puVar25 + -3) = local_2720._8_4_;
                }
              }
            }
          }
          auVar46 = vcmpps_avx(local_2700,auVar40._0_16_,6);
          auVar38 = ZEXT1664(auVar46);
          if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar46[0xf] < '\0') {
            local_26a8 = (ulong)((uint)uVar32 & 0xf) - 8;
            if (local_26a8 != 0) {
              local_26a0 = 0;
              local_2570 = auVar46;
              do {
                local_2640.geomID = *(uint *)((uVar32 & 0xfffffffffffffff0) + local_26a0 * 8);
                local_2610 = (context->scene->geometries).items[local_2640.geomID].ptr;
                uVar22 = local_2610->mask;
                auVar37._4_4_ = uVar22;
                auVar37._0_4_ = uVar22;
                auVar37._8_4_ = uVar22;
                auVar37._12_4_ = uVar22;
                auVar46 = vpand_avx(auVar37,*(undefined1 (*) [16])(ray + 0x90));
                auVar46 = vpcmpeqd_avx(auVar46,_DAT_01f7aa10);
                auVar36 = auVar38._0_16_ & ~auVar46;
                if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar36[0xf] < '\0') {
                  local_2720 = vandnps_avx(auVar46,auVar38._0_16_);
                  local_2640.geometryUserPtr = local_2610->userPtr;
                  local_2640.valid = (int *)local_2720;
                  auVar46 = (undefined1  [16])local_2640._0_16_;
                  local_2640.context = context->user;
                  local_2640.N = 4;
                  local_2640.primID =
                       *(undefined4 *)((uVar32 & 0xfffffffffffffff0) + 4 + local_26a0 * 8);
                  local_2640._0_20_ = CONCAT416(local_2640.primID,auVar46);
                  local_2608 = 0;
                  local_2600 = context->args;
                  pp_Var24 = (_func_int **)local_2600->intersect;
                  if (pp_Var24 == (_func_int **)0x0) {
                    pp_Var24 = local_2610[1].super_RefCount._vptr_RefCount;
                  }
                  local_2640.rayhit = (RTCRayHitN *)ray;
                  (*(code *)pp_Var24)(&local_2640);
                  auVar62 = ZEXT1664(local_2580);
                  auVar63 = ZEXT1664(local_2590);
                  auVar64 = ZEXT1664(local_25a0);
                  auVar60 = ZEXT1664(CONCAT412(fStack_2654,
                                               CONCAT48(fStack_2658,CONCAT44(fStack_265c,local_2660)
                                                       )));
                  auVar61 = ZEXT1664(CONCAT412(fStack_2664,
                                               CONCAT48(fStack_2668,CONCAT44(fStack_266c,local_2670)
                                                       )));
                  auVar59 = ZEXT1664(CONCAT412(fStack_2674,
                                               CONCAT48(fStack_2678,CONCAT44(fStack_267c,local_2680)
                                                       )));
                  auVar38 = ZEXT1664(local_2570);
                  context = local_26c0;
                  ray = local_26c8;
                  uVar29 = local_26b0;
                  uVar30 = local_26b8;
                }
                auVar46 = auVar38._0_16_;
                local_26a0 = local_26a0 + 1;
              } while (local_26a8 != local_26a0);
            }
            auVar36 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),local_2700,1);
            auVar36 = auVar46 & auVar36;
            if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar36[0xf] < '\0') {
              local_2700 = vblendvps_avx(local_2700,*(undefined1 (*) [16])(ray + 0x80),auVar46);
              auVar46 = vshufps_avx(local_2700,local_2700,0xb1);
              auVar46 = vmaxps_avx(auVar46,local_2700);
              auVar36 = vshufpd_avx(auVar46,auVar46,1);
              local_26f0 = vmaxss_avx(auVar36,auVar46);
            }
          }
        }
        uVar23 = local_26f0._0_4_;
        auVar38 = ZEXT3264(CONCAT428(uVar23,CONCAT424(uVar23,CONCAT420(uVar23,CONCAT416(uVar23,
                                                  CONCAT412(uVar23,CONCAT48(uVar23,CONCAT44(uVar23,
                                                  uVar23))))))));
LAB_005f2dea:
      } while (puVar25 != &local_23a0);
    } while (local_26d0 != 0);
  }
  return;
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }